

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::DeformableConv2D_x86_fma::forward
          (DeformableConv2D_x86_fma *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  Mat *pMVar3;
  size_t _elemsize;
  Mat *this_00;
  _func_int **pp_Var4;
  bool bVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  uint _w;
  int iVar11;
  uint uVar12;
  long lVar13;
  _func_int *p_Var14;
  int *piVar15;
  int iVar16;
  uint _h;
  int _h_00;
  uint uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  bool bVar21;
  int iVar22;
  float *pfVar23;
  _func_int **pp_Var24;
  void *pvVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  bool bVar29;
  long lVar30;
  bool bVar31;
  bool bVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [16];
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  ulong local_260;
  Mat local_248;
  ulong local_200;
  _func_int *local_1f8;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1d8;
  ulong local_1d0;
  _func_int **local_1c8;
  pointer local_1c0;
  Mat local_1b8;
  Mat *local_170;
  ulong local_168;
  ulong local_160;
  void *local_158;
  long local_150;
  _func_int **local_148;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_140;
  ulong local_138;
  pointer local_130;
  void *local_128;
  void *local_120;
  DeformableConv2D_x86_fma *local_118;
  _func_int **local_110;
  Mat local_108;
  Mat local_c0;
  Mat local_78;
  
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_1c0 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  local_200 = (ulong)(uint)pMVar3->w;
  iVar1 = pMVar3->h;
  p_Var14 = this->_vptr_DeformableConv2D_x86_fma[-3];
  iVar2 = pMVar3->c;
  _elemsize = pMVar3->elemsize;
  uVar20 = (long)(~((*(int *)(&this->field_0xd4 + (long)p_Var14) + -1) *
                   *(int *)(&this->field_0xdc + (long)p_Var14)) + pMVar3->w +
                  *(int *)(&this->field_0xec + (long)p_Var14) +
                 *(int *)(&this->field_0xf0 + (long)p_Var14)) /
           (long)*(int *)(&this->field_0xe4 + (long)p_Var14);
  local_160 = uVar20 & 0xffffffff;
  iVar11 = (~((*(int *)(&this->field_0xd8 + (long)p_Var14) + -1) *
             *(int *)(&this->field_0xe0 + (long)p_Var14)) + iVar1 +
            *(int *)(&this->field_0xf4 + (long)p_Var14) +
           *(int *)(&this->field_0xf8 + (long)p_Var14)) /
           *(int *)(&this->field_0xe8 + (long)p_Var14);
  _w = (int)uVar20 + 1;
  local_1b8.cstep = 0;
  _h = iVar11 + 1;
  _h_00 = _h * _w;
  local_1b8.data = (void *)0x0;
  local_1b8.refcount._0_4_ = 0;
  local_1b8.refcount._4_4_ = 0;
  local_1b8.elemsize._0_4_ = 0;
  local_1b8.elemsize._4_4_ = 0;
  local_1b8.elempack = 0;
  local_1b8.allocator = (Allocator *)0x0;
  local_1b8.dims = 0;
  local_1b8.w = 0;
  local_1b8.h = 0;
  local_1b8.d = 0;
  local_1b8.c = 0;
  local_1d8 = top_blobs;
  local_140 = bottom_blobs;
  Mat::create(&local_1b8,
              *(int *)(&this->field_0xd8 + (long)p_Var14) * iVar2 *
              *(int *)(&this->field_0xd4 + (long)p_Var14) * _h_00,_elemsize,opt->blob_allocator);
  iVar18 = -100;
  if ((local_1b8.data != (void *)0x0) && ((long)local_1b8.c * local_1b8.cstep != 0)) {
    this_00 = (local_1d8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_00,*(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86_fma[-3])
                ,_h_00,_elemsize,opt->blob_allocator);
    iVar18 = -100;
    if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
      iVar18 = iVar1 * (int)local_200;
      local_170 = this_00;
      Mat::reshape(&local_78,pMVar3,iVar18 * iVar2,(Allocator *)0x0);
      Mat::reshape(&local_c0,pMVar3 + 1,pMVar3[1].h * pMVar3[1].w * pMVar3[1].c,(Allocator *)0x0);
      pp_Var4 = this->_vptr_DeformableConv2D_x86_fma;
      pp_Var24 = pp_Var4;
      if (-1 < iVar11) {
        local_1c0 = (pointer)((long)local_1c0 - (long)pMVar3);
        local_120 = local_78.data;
        iVar11 = (int)local_200;
        local_128 = local_c0.data;
        local_158 = local_1b8.data;
        local_1ec = iVar11 + -1;
        local_1d0 = (ulong)_w;
        local_168 = (ulong)_h;
        uVar20 = 0;
        do {
          if (-1 < (int)local_160) {
            local_150 = uVar20 * local_1d0;
            local_1c8 = this->_vptr_DeformableConv2D_x86_fma;
            p_Var14 = pp_Var4[-3];
            local_260 = 0;
            do {
              if (0 < *(int *)(&this->field_0xd8 + (long)p_Var14)) {
                iVar19 = (int)uVar20;
                local_1e4 = *(int *)(&this->field_0xe8 + (long)p_Var14) * iVar19 -
                            *(int *)(&this->field_0xf4 + (long)p_Var14);
                iVar22 = (int)local_260;
                local_1e8 = *(int *)(&this->field_0xe4 + (long)p_Var14) * iVar22 -
                            *(int *)(&this->field_0xec + (long)p_Var14);
                pfVar23 = (float *)((long)local_1b8.data +
                                   (long)(((int)local_150 + iVar22) * iVar2 *
                                          *(int *)(&this->field_0xd8 + (long)p_Var14) *
                                         *(int *)(&this->field_0xd4 + (long)p_Var14)) * 4);
                local_110 = this->_vptr_DeformableConv2D_x86_fma;
                local_1f8 = local_1c8[-3];
                iVar27 = 0;
                do {
                  iVar16 = *(int *)(&this->field_0xd4 + (long)local_1f8);
                  if (0 < iVar16) {
                    local_130 = (local_140->
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                super__Vector_impl_data._M_start;
                    iVar10 = 0;
                    do {
                      local_1dc = iVar10;
                      iVar16 = iVar16 * iVar27 + local_1dc;
                      fVar33 = 1.0;
                      if (local_1c0 == (pointer)0xd8) {
                        fVar33 = *(float *)((long)local_130[2].data +
                                           local_260 * 4 +
                                           (long)local_130[2].w * uVar20 * local_130[2].elemsize +
                                           (long)iVar16 * local_130[2].cstep * local_130[2].elemsize
                                           );
                      }
                      fVar7 = (float)(*(int *)(&this->field_0xe0 + (long)local_110[-3]) * iVar27 +
                                     local_1e4) +
                              *(float *)((long)local_c0.data +
                                        (long)(int)((iVar16 * 2 * _h + iVar19) * _w + iVar22) * 4);
                      fVar8 = (float)(*(int *)(&this->field_0xdc + (long)local_110[-3]) * local_1dc
                                     + local_1e8) +
                              *(float *)((long)local_c0.data +
                                        (long)(int)(((iVar16 * 2 + 1) * _h + iVar19) * _w + iVar22)
                                        * 4);
                      if (((float)iVar11 <= fVar8 || (float)iVar1 <= fVar7) ||
                          (fVar8 <= -1.0 || fVar7 <= -1.0)) {
                        auVar34 = SUB6416(ZEXT864(0),0);
                        bVar32 = false;
                        auVar35 = SUB6416(ZEXT864(0),0);
                        auVar36 = ZEXT816(0) << 0x40;
                        bVar31 = false;
                        bVar21 = false;
                        bVar29 = false;
                        lVar30 = 0;
                        lVar28 = 0;
                        lVar13 = 0;
                        lVar26 = 0;
                        fVar37 = 0.0;
                      }
                      else {
                        auVar34 = vroundss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7),9);
                        uVar17 = (uint)auVar34._0_4_;
                        auVar35 = vroundss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8),9);
                        uVar12 = (uint)auVar35._0_4_;
                        fVar39 = fVar7 - auVar34._0_4_;
                        fVar9 = fVar8 - auVar35._0_4_;
                        bVar5 = (int)uVar12 < local_1ec;
                        bVar31 = -1 < (int)uVar17 && bVar5;
                        bVar6 = (int)uVar17 < iVar1 + -1;
                        bVar21 = -1 < (int)uVar12 && bVar6;
                        bVar29 = bVar6 && bVar5;
                        bVar32 = -1 < (int)(uVar17 | uVar12);
                        lVar30 = (long)(int)(iVar11 * uVar17 + uVar12);
                        if (!bVar32) {
                          lVar30 = 0;
                        }
                        lVar28 = (long)(int)(uVar12 + iVar11 * uVar17 + 1);
                        if (-1 >= (int)uVar17 || !bVar5) {
                          lVar28 = 0;
                        }
                        iVar16 = (uVar17 + 1) * iVar11;
                        lVar13 = (long)(int)(uVar12 + iVar16);
                        if (-1 >= (int)uVar12 || !bVar6) {
                          lVar13 = 0;
                        }
                        lVar26 = (long)(int)(iVar16 + uVar12 + 1);
                        if (!bVar6 || !bVar5) {
                          lVar26 = 0;
                        }
                        fVar37 = (1.0 - fVar9) * (1.0 - fVar39);
                        auVar34 = ZEXT416((uint)(fVar9 * (1.0 - fVar39)));
                        auVar35 = ZEXT416((uint)((1.0 - fVar9) * fVar39));
                        auVar36 = ZEXT416((uint)(fVar9 * fVar39));
                      }
                      pvVar25 = local_78.data;
                      iVar16 = iVar2;
                      if (0 < iVar2) {
                        do {
                          auVar40 = ZEXT816(0) << 0x40;
                          if (((float)iVar11 > fVar8 && (float)iVar1 > fVar7) &&
                              (fVar8 > -1.0 && fVar7 > -1.0)) {
                            auVar38 = ZEXT816(0) << 0x40;
                            fVar39 = 0.0;
                            if (bVar32) {
                              fVar39 = *(float *)((long)pvVar25 + lVar30 * 4);
                            }
                            if (bVar31) {
                              auVar38 = ZEXT416(*(uint *)((long)pvVar25 + lVar28 * 4));
                            }
                            auVar41 = ZEXT816(0) << 0x40;
                            if (bVar21) {
                              auVar40 = ZEXT416(*(uint *)((long)pvVar25 + lVar13 * 4));
                            }
                            if (bVar29) {
                              auVar41 = ZEXT416(*(uint *)((long)pvVar25 + lVar26 * 4));
                            }
                            auVar38 = vfmadd213ss_fma(auVar38,auVar34,
                                                      ZEXT416((uint)(fVar39 * fVar37)));
                            auVar40 = vfmadd213ss_fma(auVar40,auVar35,auVar38);
                            auVar40 = vfmadd231ss_fma(auVar40,auVar36,auVar41);
                          }
                          *pfVar23 = auVar40._0_4_ * fVar33;
                          pfVar23 = pfVar23 + 1;
                          pvVar25 = (void *)((long)pvVar25 + (long)iVar18 * 4);
                          iVar16 = iVar16 + -1;
                        } while (iVar16 != 0);
                        local_1f8 = local_1c8[-3];
                      }
                      iVar16 = *(int *)(&this->field_0xd4 + (long)local_1f8);
                      iVar10 = local_1dc + 1;
                    } while (local_1dc + 1 < iVar16);
                    p_Var14 = pp_Var4[-3];
                    local_1e0 = iVar27;
                  }
                  iVar27 = iVar27 + 1;
                } while (iVar27 < *(int *)(&this->field_0xd8 + (long)p_Var14));
              }
              local_260 = local_260 + 1;
              local_138 = uVar20;
            } while (local_260 != local_1d0);
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != local_168);
        pp_Var24 = this->_vptr_DeformableConv2D_x86_fma;
        local_148 = pp_Var4;
        local_118 = this;
      }
      Mat::reshape(&local_248,&local_1b8,
                   iVar2 * *(int *)(&this->field_0xd8 + (long)pp_Var24[-3]) *
                   *(int *)(&this->field_0xd4 + (long)pp_Var24[-3]),_h_00,(Allocator *)0x0);
      piVar15 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + 1;
        UNLOCK();
      }
      piVar15 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (local_1b8.allocator == (Allocator *)0x0) {
            if (local_1b8.data != (void *)0x0) {
              free(local_1b8.data);
            }
          }
          else {
            (*(local_1b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar15 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
      local_1b8.data = local_248.data;
      local_1b8.refcount._0_4_ = local_248.refcount._0_4_;
      local_1b8.refcount._4_4_ = local_248.refcount._4_4_;
      local_1b8.elemsize._0_4_ = (undefined4)local_248.elemsize;
      local_1b8.elemsize._4_4_ = local_248.elemsize._4_4_;
      local_1b8.elempack = local_248.elempack;
      local_1b8.allocator = local_248.allocator;
      local_1b8.dims = local_248.dims;
      local_1b8.w = local_248.w;
      local_1b8.h = local_248.h;
      local_1b8.d = local_248.d;
      local_1b8.c = local_248.c;
      local_1b8.cstep = local_248.cstep;
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (local_248.allocator == (Allocator *)0x0) {
            if (local_248.data != (void *)0x0) {
              free(local_248.data);
            }
          }
          else {
            (*(local_248.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      pMVar3 = local_170;
      (*this->inner_product->_vptr_Layer[7])(this->inner_product,&local_1b8,local_170,opt);
      local_248.cstep = 0;
      local_248.data = (void *)0x0;
      local_248.refcount._0_4_ = 0;
      local_248.refcount._4_4_ = 0;
      local_248.elemsize._0_4_ = 0;
      local_248.elemsize._4_4_ = 0;
      local_248.elempack = 0;
      local_248.allocator = (Allocator *)0x0;
      local_248.dims = 0;
      local_248.w = 0;
      local_248.h = 0;
      local_248.d = 0;
      local_248.c = 0;
      (*this->permute->_vptr_Layer[7])(this->permute,pMVar3,&local_248,opt);
      Mat::reshape(&local_108,&local_248,_w,_h,
                   *(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86_fma[-3]),
                   (Allocator *)0x0);
      if (local_108.refcount != (int *)0x0) {
        LOCK();
        *local_108.refcount = *local_108.refcount + 1;
        UNLOCK();
      }
      piVar15 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (local_248.allocator == (Allocator *)0x0) {
            if (local_248.data != (void *)0x0) {
              free(local_248.data);
            }
          }
          else {
            (*(local_248.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_248.data = local_108.data;
      local_248.refcount._0_4_ = SUB84(local_108.refcount,0);
      local_248.refcount._4_4_ = (undefined4)((ulong)local_108.refcount >> 0x20);
      local_248.elemsize._0_4_ = (undefined4)local_108.elemsize;
      local_248.elemsize._4_4_ = (undefined4)(local_108.elemsize >> 0x20);
      local_248.elempack = local_108.elempack;
      local_248.allocator = local_108.allocator;
      local_248.dims = local_108.dims;
      local_248.w = local_108.w;
      local_248.h = local_108.h;
      local_248.d = local_108.d;
      local_248.c = local_108.c;
      local_248.cstep = local_108.cstep;
      if (local_108.refcount != (int *)0x0) {
        LOCK();
        *local_108.refcount = *local_108.refcount + -1;
        UNLOCK();
        if (*local_108.refcount == 0) {
          if (local_108.allocator == (Allocator *)0x0) {
            if (local_108.data != (void *)0x0) {
              free(local_108.data);
            }
          }
          else {
            (*(local_108.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      pMVar3 = (local_1d8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar15 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
      if (pMVar3 != &local_248) {
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + 1;
          UNLOCK();
        }
        piVar15 = pMVar3->refcount;
        if (piVar15 != (int *)0x0) {
          LOCK();
          *piVar15 = *piVar15 + -1;
          UNLOCK();
          if (*piVar15 == 0) {
            if (pMVar3->allocator == (Allocator *)0x0) {
              if (pMVar3->data != (void *)0x0) {
                free(pMVar3->data);
              }
            }
            else {
              (*pMVar3->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar3->cstep = 0;
        pMVar3->data = (void *)0x0;
        pMVar3->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar3->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar3->elemsize + 4) = 0;
        pMVar3->dims = 0;
        pMVar3->w = 0;
        pMVar3->h = 0;
        pMVar3->d = 0;
        pMVar3->c = 0;
        piVar15 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
        pMVar3->data = local_248.data;
        pMVar3->refcount = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
        pMVar3->elemsize = CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize);
        pMVar3->elempack = local_248.elempack;
        pMVar3->allocator = local_248.allocator;
        pMVar3->dims = local_248.dims;
        pMVar3->w = local_248.w;
        pMVar3->h = local_248.h;
        pMVar3->d = local_248.d;
        pMVar3->c = local_248.c;
        pMVar3->cstep = local_248.cstep;
      }
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (local_248.allocator == (Allocator *)0x0) {
            if (local_248.data != (void *)0x0) {
              free(local_248.data);
            }
          }
          else {
            (*(local_248.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_c0.refcount != (int *)0x0) {
        LOCK();
        *local_c0.refcount = *local_c0.refcount + -1;
        UNLOCK();
        if (*local_c0.refcount == 0) {
          if (local_c0.allocator == (Allocator *)0x0) {
            if (local_c0.data != (void *)0x0) {
              free(local_c0.data);
            }
          }
          else {
            (*(local_c0.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if (local_78.data != (void *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar18 = 0;
    }
  }
  piVar15 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
  if (piVar15 != (int *)0x0) {
    LOCK();
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        if (local_1b8.data != (void *)0x0) {
          free(local_1b8.data);
        }
      }
      else {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar18;
}

Assistant:

int DeformableConv2D_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& offset = bottom_blobs[1];

    const bool has_mask = (bottom_blobs.size() == 3);

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int in_c = bottom_blob.c;
    const size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int out_w = (w + pad_left + pad_right - kernel_extent_w) / stride_w + 1;
    const int out_h = (h + pad_top + pad_bottom - kernel_extent_h) / stride_h + 1;

    // output = im2col matmul weight_t, im2col.shape is [out_h * out_w, kernel_h * kernel_w * in_c] (in python),
    // weight_t.shape is [num_output, kernel_h * kernel_w * in_c] (in python),
    // output.shape   is [out_h * out_w, num_output] (in python).
    Mat im2col;
    im2col.create(kernel_h * kernel_w * in_c * out_h * out_w, elemsize, opt.blob_allocator);
    if (im2col.empty())
        return -100;

    Mat& output = top_blobs[0];
    output.create(num_output, out_h * out_w, elemsize, opt.blob_allocator);
    if (output.empty())
        return -100;

    Mat bottom_blob_flatten = bottom_blob.reshape(w * h * in_c);
    Mat offset_flatten = offset.reshape(offset.w * offset.h * offset.c);
    const float* data_im_ptr = bottom_blob_flatten;
    const float* data_offset_ptr = offset_flatten;
    float* im2col_ptr = im2col;

    // im2col
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int h_col = 0; h_col < out_h; h_col++)
    {
        for (int w_col = 0; w_col < out_w; w_col++)
        {
            int h_in = h_col * stride_h - pad_top;
            int w_in = w_col * stride_w - pad_left;
            float* data_col_ptr = im2col_ptr + (h_col * out_w + w_col) * kernel_h * kernel_w * in_c;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    const int data_offset_h_ptr = (((i * kernel_w + j) * 2) * out_h + h_col) * out_w + w_col;
                    const int data_offset_w_ptr = (((i * kernel_w + j) * 2 + 1) * out_h + h_col) * out_w + w_col;

                    const float offset_h = data_offset_ptr[data_offset_h_ptr];
                    const float offset_w = data_offset_ptr[data_offset_w_ptr];
                    const float mask_ = has_mask ? bottom_blobs[2].channel(i * kernel_w + j).row(h_col)[w_col] : 1.f;
                    const float h_im = h_in + i * dilation_h + offset_h;
                    const float w_im = w_in + j * dilation_w + offset_w;

                    // Bilinear
                    const bool cond = h_im > -1 && w_im > -1 && h_im < h && w_im < w;
                    float w1 = 0.f;
                    float w2 = 0.f;
                    float w3 = 0.f;
                    float w4 = 0.f;
                    bool v1_cond = false;
                    bool v2_cond = false;
                    bool v3_cond = false;
                    bool v4_cond = false;
                    int v1_pos = 0;
                    int v2_pos = 0;
                    int v3_pos = 0;
                    int v4_pos = 0;
                    if (cond)
                    {
                        int h_low = floor(h_im);
                        int w_low = floor(w_im);
                        int h_high = h_low + 1;
                        int w_high = w_low + 1;

                        float lh = h_im - h_low;
                        float lw = w_im - w_low;
                        float hh = 1 - lh;
                        float hw = 1 - lw;

                        v1_cond = (h_low >= 0 && w_low >= 0);
                        v2_cond = (h_low >= 0 && w_high <= w - 1);
                        v3_cond = (h_high <= h - 1 && w_low >= 0);
                        v4_cond = (h_high <= h - 1 && w_high <= w - 1);
                        if (v1_cond)
                            v1_pos = h_low * w + w_low;
                        if (v2_cond)
                            v2_pos = h_low * w + w_high;
                        if (v3_cond)
                            v3_pos = h_high * w + w_low;
                        if (v4_cond)
                            v4_pos = h_high * w + w_high;

                        w1 = hh * hw;
                        w2 = hh * lw;
                        w3 = lh * hw;
                        w4 = lh * lw;
                    }

                    const float* data_im_channel_ptr = data_im_ptr;
                    for (int c_im = 0; c_im < in_c; c_im++)
                    {
                        float val = 0.f;
                        if (cond)
                        {
                            float v1 = v1_cond ? data_im_channel_ptr[v1_pos] : 0.f;
                            float v2 = v2_cond ? data_im_channel_ptr[v2_pos] : 0.f;
                            float v3 = v3_cond ? data_im_channel_ptr[v3_pos] : 0.f;
                            float v4 = v4_cond ? data_im_channel_ptr[v4_pos] : 0.f;
                            val = w1 * v1 + w2 * v2 + w3 * v3 + w4 * v4;
                        }
                        *data_col_ptr = val * mask_;
                        data_col_ptr += 1;
                        data_im_channel_ptr += h * w;
                    }
                }
            }
        }
    }
    im2col = im2col.reshape(kernel_h * kernel_w * in_c, out_h * out_w);
    // call InnerProduct
    inner_product->forward(im2col, output, opt);
    ncnn::Mat output_t;
    // call Permute
    permute->forward(output, output_t, opt);
    output_t = output_t.reshape(out_w, out_h, num_output);
    top_blobs[0] = output_t;
    return 0;
}